

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames.cpp
# Opt level: O1

UBool __thiscall
icu_63::TimeZoneNamesDelegate::operator==(TimeZoneNamesDelegate *this,TimeZoneNames *other)

{
  long lVar1;
  bool bVar2;
  
  if (this == (TimeZoneNamesDelegate *)other) {
    bVar2 = true;
  }
  else {
    bVar2 = false;
    lVar1 = __dynamic_cast(other,&TimeZoneNames::typeinfo,&typeinfo,0);
    if (lVar1 != 0) {
      bVar2 = this->fTZnamesCacheEntry == *(TimeZoneNamesCacheEntry **)(lVar1 + 8);
    }
  }
  return bVar2;
}

Assistant:

UBool
TimeZoneNamesDelegate::operator==(const TimeZoneNames& other) const {
    if (this == &other) {
        return TRUE;
    }
    // Just compare if the other object also use the same
    // cache entry
    const TimeZoneNamesDelegate* rhs = dynamic_cast<const TimeZoneNamesDelegate*>(&other);
    if (rhs) {
        return fTZnamesCacheEntry == rhs->fTZnamesCacheEntry;
    }
    return FALSE;
}